

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O0

double calc_kurtosis<float,long_double>
                 (size_t *ix_arr,size_t st,size_t end,float *x,MissingAction missing_action)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  long in_RCX;
  ulong in_RDX;
  ulong in_RSI;
  long in_RDI;
  int in_R8D;
  double in_XMM0_Qa;
  double __value;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double __value_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double __value_01;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double dVar12;
  double __value_02;
  size_t row_1;
  size_t cnt;
  size_t row;
  longdouble out;
  longdouble n;
  longdouble diff;
  longdouble delta_div;
  longdouble delta_s;
  longdouble delta;
  longdouble M4;
  longdouble M3;
  longdouble M2;
  longdouble m;
  double local_150;
  ushort uVar13;
  MissingAction in_stack_fffffffffffffebc;
  MissingAction missing_action_00;
  undefined1 uVar14;
  float *in_stack_fffffffffffffec0;
  undefined7 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffecf;
  bool bVar15;
  size_t in_stack_fffffffffffffed0;
  size_t *in_stack_fffffffffffffed8;
  ulong local_f0;
  long local_e8;
  ulong local_e0;
  double local_8;
  
  fVar1 = 0.0;
  local_e0 = in_RSI;
  fVar2 = fVar1;
  fVar6 = fVar1;
  fVar7 = fVar1;
  if (in_R8D == 0) {
    for (; local_e0 <= in_RDX; local_e0 = local_e0 + 1) {
      in_stack_fffffffffffffed0 = (local_e0 - in_RSI) + 1;
      fVar3 = (float)(&DAT_006c0110)[(long)in_stack_fffffffffffffed0 < 0] +
              (float)(long)in_stack_fffffffffffffed0;
      fVar8 = *(float *)(in_RCX + *(long *)(in_RDI + local_e0 * 8) * 4) - fVar7;
      fVar4 = fVar8 / fVar3;
      in_stack_fffffffffffffed8 = (size_t *)(local_e0 - in_RSI);
      fVar8 = ((float)(&DAT_006c0110)[(long)in_stack_fffffffffffffed8 < 0] +
              (float)(long)in_stack_fffffffffffffed8) * fVar4 * fVar8;
      fVar5 = fVar1 * fVar4 * -4.0;
      fVar1 = fVar1 + ((fVar3 + -2.0) * fVar8 * fVar4 - fVar6 * fVar4 * 3.0);
      fVar2 = fVar2 + fVar5 + fVar8 * fVar4 * fVar4 * ((fVar3 * fVar3 - fVar3 * 3.0) + 3.0) +
                              fVar6 * fVar4 * fVar4 * 6.0;
      fVar6 = fVar6 + fVar8;
      fVar7 = fVar7 + fVar4;
    }
    uVar9 = std::isnan(in_XMM0_Qa);
    bVar15 = false;
    dVar12 = __value;
    if ((uVar9 & 1) == 0) {
      uVar9 = std::isinf(__value);
      bVar15 = false;
      dVar12 = extraout_XMM0_Qa;
      if ((uVar9 & 1) == 0) {
        bVar15 = fVar6 <= 0.0;
      }
    }
    if ((bVar15 == false) ||
       (bVar15 = check_more_than_two_unique_values<float>
                           (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                            CONCAT17(bVar15,in_stack_fffffffffffffec8),in_stack_fffffffffffffec0,
                            in_stack_fffffffffffffebc), dVar12 = extraout_XMM0_Qa_00, bVar15)) {
      lVar11 = (in_RDX - in_RSI) + 1;
      fVar1 = (float)(&DAT_006c0110)[lVar11 < 0];
      uVar9 = std::isnan(dVar12);
      if (((uVar9 & 1) == 0) && (uVar9 = std::isinf(__value_00), (uVar9 & 1) == 0)) {
        local_8 = (double)(((fVar1 + (float)lVar11) / fVar6) * (fVar2 / fVar6));
        if (local_8 <= 0.0) {
          local_8 = 0.0;
        }
      }
      else {
        local_8 = -INFINITY;
      }
    }
    else {
      local_8 = -INFINITY;
    }
  }
  else {
    local_e8 = 0;
    for (local_f0 = in_RSI; local_f0 <= in_RDX; local_f0 = local_f0 + 1) {
      uVar9 = std::isnan((double)(ulong)*(uint *)(in_RCX + *(long *)(in_RDI + local_f0 * 8) * 4));
      in_stack_fffffffffffffebc = CONCAT13(1,(int3)in_stack_fffffffffffffebc);
      in_XMM0_Qa = extraout_XMM0_Qa_01;
      if ((uVar9 & 1) == 0) {
        iVar10 = std::isinf((double)(ulong)*(uint *)(in_RCX + *(long *)(in_RDI + local_f0 * 8) * 4))
        ;
        in_stack_fffffffffffffebc = CONCAT13((char)iVar10,(int3)in_stack_fffffffffffffebc);
        in_XMM0_Qa = extraout_XMM0_Qa_02;
      }
      if ((((byte)(in_stack_fffffffffffffebc >> 0x18) ^ 0xff) & 1) != 0) {
        lVar11 = local_e8 + 1;
        fVar5 = (float)(&DAT_006c0110)[lVar11 < 0] + (float)lVar11;
        fVar3 = *(float *)(in_RCX + *(long *)(in_RDI + local_f0 * 8) * 4) - fVar7;
        fVar4 = fVar3 / fVar5;
        fVar3 = ((float)(&DAT_006c0110)[local_e8 < 0] + (float)local_e8) * fVar4 * fVar3;
        fVar7 = fVar7 + fVar4;
        fVar1 = fVar1 + fVar2 * fVar4 * -4.0 +
                        fVar3 * fVar4 * fVar4 * ((fVar5 * fVar5 - fVar5 * 3.0) + 3.0) +
                        fVar6 * fVar4 * fVar4 * 6.0;
        fVar2 = fVar2 + ((fVar5 + -2.0) * fVar3 * fVar4 - fVar6 * fVar4 * 3.0);
        fVar6 = fVar6 + fVar3;
        local_e8 = lVar11;
      }
    }
    if (local_e8 == 0) {
      local_8 = -INFINITY;
    }
    else {
      uVar9 = std::isnan(in_XMM0_Qa);
      missing_action_00 =
           CONCAT13((char)(in_stack_fffffffffffffebc >> 0x18),
                    (uint3)(ushort)in_stack_fffffffffffffebc);
      dVar12 = __value_01;
      if ((uVar9 & 1) == 0) {
        uVar9 = std::isinf(__value_01);
        uVar14 = (undefined1)(missing_action_00 >> 0x18);
        uVar13 = (ushort)missing_action_00;
        missing_action_00 = CONCAT13(uVar14,(uint3)uVar13);
        dVar12 = extraout_XMM0_Qa_03;
        if ((uVar9 & 1) == 0) {
          missing_action_00 = CONCAT13(uVar14,CONCAT12(fVar6 <= 0.0,uVar13));
        }
      }
      if (((char)(missing_action_00 >> 0x10) == '\0') ||
         (bVar15 = check_more_than_two_unique_values<float>
                             (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                              CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                              in_stack_fffffffffffffec0,missing_action_00),
         dVar12 = extraout_XMM0_Qa_04, bVar15)) {
        fVar2 = (float)(&DAT_006c0110)[local_e8 < 0];
        uVar9 = std::isnan(dVar12);
        if (((uVar9 & 1) == 0) && (uVar9 = std::isinf(__value_02), (uVar9 & 1) == 0)) {
          local_150 = (double)(((fVar2 + (float)local_e8) / fVar6) * (fVar1 / fVar6));
          if (local_150 <= 0.0) {
            local_150 = 0.0;
          }
        }
        else {
          local_150 = -INFINITY;
        }
        local_8 = local_150;
      }
      else {
        local_8 = -INFINITY;
      }
    }
  }
  return local_8;
}

Assistant:

double calc_kurtosis(size_t ix_arr[], size_t st, size_t end, real_t x[], MissingAction missing_action)
{
    ldouble_safe m = 0;
    ldouble_safe M2 = 0, M3 = 0, M4 = 0;
    ldouble_safe delta, delta_s, delta_div;
    ldouble_safe diff, n;
    ldouble_safe out;

    if (missing_action == Fail)
    {
        for (size_t row = st; row <= end; row++)
        {
            n  =  (ldouble_safe)(row - st + 1);

            delta      =  x[ix_arr[row]] - m;
            delta_div  =  delta / n;
            delta_s    =  delta_div * delta_div;
            diff       =  delta * (delta_div * (ldouble_safe)(row - st));

            m   +=  delta_div;
            M4  +=  diff * delta_s * (n * n - 3 * n + 3) + 6 * delta_s * M2 - 4 * delta_div * M3;
            M3  +=  diff * delta_div * (n - 2) - 3 * delta_div * M2;
            M2  +=  diff;
        }

        if (unlikely(!is_na_or_inf(M2) && M2 <= 0))
        {
            if (!check_more_than_two_unique_values(ix_arr, st, end, x, missing_action))
                return -HUGE_VAL;
        }

        out = ( M4 / M2 ) * ( (ldouble_safe)(end - st + 1) / M2 );
        return (!is_na_or_inf(out))? std::fmax((double)out, 0.) : (-HUGE_VAL);
    }

    else
    {
        size_t cnt = 0;
        for (size_t row = st; row <= end; row++)
        {
            if (likely(!is_na_or_inf(x[ix_arr[row]])))
            {
                cnt++;
                n = (ldouble_safe) cnt;

                delta      =  x[ix_arr[row]] - m;
                delta_div  =  delta / n;
                delta_s    =  delta_div * delta_div;
                diff       =  delta * (delta_div * (ldouble_safe)(cnt - 1));

                m   +=  delta_div;
                M4  +=  diff * delta_s * (n * n - 3 * n + 3) + 6 * delta_s * M2 - 4 * delta_div * M3;
                M3  +=  diff * delta_div * (n - 2) - 3 * delta_div * M2;
                M2  +=  diff;
            }
        }

        if (unlikely(cnt == 0)) return -HUGE_VAL;
        if (unlikely(!is_na_or_inf(M2) && M2 <= 0))
        {
            if (!check_more_than_two_unique_values(ix_arr, st, end, x, missing_action))
                return -HUGE_VAL;
        }

        out = ( M4 / M2 ) * ( (ldouble_safe)cnt / M2 );
        return (!is_na_or_inf(out))? std::fmax((double)out, 0.) : (-HUGE_VAL);
    }
}